

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_rem_sparc(floatx80 a,floatx80 b,float_status *status)

{
  _Bool _Var1;
  flag fVar2;
  uint64_t uVar3;
  uint16_t uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 fVar6;
  floatx80 fVar7;
  ulong local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t alternateASig1;
  uint64_t alternateASig0;
  uint64_t term1;
  uint64_t term0;
  uint64_t q;
  uint64_t bSig;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t expDiff;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  
  status_local = (float_status *)b.low;
  b_local._8_8_ = a.low;
  b_local.low._0_2_ = b.high;
  uVar4 = a.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var1 = floatx80_invalid_encoding(a_00);
  if ((_Var1) ||
     (a_01.high = (uint16_t)b_local.low, a_01.low = (uint64_t)status_local, a_01._10_6_ = 0,
     _Var1 = floatx80_invalid_encoding(a_01), _Var1)) {
    float_raise_sparc('\x01',_aExp);
    fVar6 = floatx80_default_nan_sparc(_aExp);
    uVar4 = fVar6.high;
    goto LAB_00d94a63;
  }
  a_02.high = uVar4;
  a_02.low = b_local._8_8_;
  a_02._10_6_ = 0;
  aSig1 = extractFloatx80Frac(a_02);
  a_03.high = uVar4;
  a_03.low = b_local._8_8_;
  a_03._10_6_ = 0;
  expDiff = extractFloatx80Exp(a_03);
  a_04.high = uVar4;
  a_04.low = b_local._8_8_;
  a_04._10_6_ = 0;
  bExp._3_1_ = extractFloatx80Sign(a_04);
  a_05.high = (uint16_t)b_local.low;
  a_05.low = (uint64_t)status_local;
  a_05._10_6_ = 0;
  q = extractFloatx80Frac(a_05);
  a_06.high = (uint16_t)b_local.low;
  a_06.low = (uint64_t)status_local;
  a_06._10_6_ = 0;
  aSig0._4_4_ = extractFloatx80Exp(a_06);
  if (expDiff == 0x7fff) {
    if (((aSig1 & 0x7fffffffffffffff) != 0) ||
       ((aSig0._4_4_ == 0x7fff && ((q & 0x7fffffffffffffff) != 0)))) {
      a_07.high = uVar4;
      a_07.low = b_local._8_8_;
      b_00.high = (uint16_t)b_local.low;
      b_00.low = (uint64_t)status_local;
      a_07._10_6_ = 0;
      b_00._10_6_ = 0;
      fVar6 = propagateFloatx80NaN_sparc(a_07,b_00,_aExp);
      uVar4 = fVar6.high;
      goto LAB_00d94a63;
    }
LAB_00d946c9:
    float_raise_sparc('\x01',_aExp);
    fVar6 = floatx80_default_nan_sparc(_aExp);
    uVar4 = fVar6.high;
  }
  else {
    if (aSig0._4_4_ == 0x7fff) {
      if ((q & 0x7fffffffffffffff) == 0) {
        fVar6._8_8_ = extraout_RDX;
        fVar6.low = b_local._8_8_;
      }
      else {
        a_08.high = uVar4;
        a_08.low = b_local._8_8_;
        b_01.high = (uint16_t)b_local.low;
        b_01.low = (uint64_t)status_local;
        a_08._10_6_ = 0;
        b_01._10_6_ = 0;
        fVar6 = propagateFloatx80NaN_sparc(a_08,b_01,_aExp);
        uVar4 = fVar6.high;
      }
      goto LAB_00d94a63;
    }
    uVar5 = extraout_RDX;
    if (aSig0._4_4_ == 0) {
      if (q == 0) goto LAB_00d946c9;
      normalizeFloatx80Subnormal_sparc(q,(int32_t *)((long)&aSig0 + 4),&q);
      uVar5 = extraout_RDX_00;
    }
    if (expDiff == 0) {
      if ((aSig1 & 0x7fffffffffffffff) == 0) {
        fVar6._8_8_ = uVar5;
        fVar6.low = b_local._8_8_;
        goto LAB_00d94a63;
      }
      normalizeFloatx80Subnormal_sparc(aSig1,&expDiff,&aSig1);
      uVar5 = extraout_RDX_01;
    }
    q = q | 0x8000000000000000;
    bExp._2_1_ = bExp._3_1_;
    aSig0._0_4_ = expDiff - aSig0._4_4_;
    bSig = 0;
    if ((int)aSig0 < 0) {
      if ((int)aSig0 < -1) {
        fVar6._8_8_ = uVar5;
        fVar6.low = b_local._8_8_;
        goto LAB_00d94a63;
      }
      shift128Right(aSig1,0,1,&aSig1,&bSig);
      aSig0._0_4_ = 0;
    }
    term0 = (uint64_t)(int)(uint)(q <= aSig1);
    if (term0 != 0) {
      aSig1 = aSig1 - q;
    }
    for (aSig0._0_4_ = (int)aSig0 + -0x40; 0 < (int)aSig0; aSig0._0_4_ = (int)aSig0 + -0x3e) {
      local_98 = estimateDiv128To64(aSig1,bSig,q);
      if (local_98 < 3) {
        local_98 = 0;
      }
      else {
        local_98 = local_98 - 2;
      }
      term0 = local_98;
      mul64To128(q,local_98,&term1,&alternateASig0);
      sub128(aSig1,bSig,term1,alternateASig0,&aSig1,&bSig);
      shortShift128Left(aSig1,bSig,0x3e,&aSig1,&bSig);
    }
    aSig0._0_4_ = (int)aSig0 + 0x40;
    if ((int)aSig0 < 1) {
      alternateASig0 = 0;
      term1 = q;
    }
    else {
      uVar3 = estimateDiv128To64(aSig1,bSig,q);
      if (uVar3 < 3) {
        local_a0 = 0;
      }
      else {
        local_a0 = uVar3 - 2;
      }
      term0 = local_a0 >> (0x40U - (char)(int)aSig0 & 0x3f);
      mul64To128(q,term0 << (0x40U - (char)(int)aSig0 & 0x3f),&term1,&alternateASig0);
      sub128(aSig1,bSig,term1,alternateASig0,&aSig1,&bSig);
      shortShift128Left(0,q,0x40 - (int)aSig0,&term1,&alternateASig0);
      while (fVar2 = le128(term1,alternateASig0,aSig1,bSig), fVar2 != '\0') {
        term0 = term0 + 1;
        sub128(aSig1,bSig,term1,alternateASig0,&aSig1,&bSig);
      }
    }
    sub128(term1,alternateASig0,aSig1,bSig,&alternateASig1,&local_90);
    fVar2 = lt128(alternateASig1,local_90,aSig1,bSig);
    if ((fVar2 != '\0') ||
       ((fVar2 = eq128(alternateASig1,local_90,aSig1,bSig), fVar2 != '\0' && ((term0 & 1) != 0)))) {
      aSig1 = alternateASig1;
      bSig = local_90;
      bExp._2_1_ = (bExp._2_1_ != 0 ^ 0xffU) & 1;
    }
    fVar6 = normalizeRoundAndPackFloatx80_sparc
                      ('P',bExp._2_1_,aSig0._4_4_ + (int)aSig0,aSig1,bSig,_aExp);
    uVar4 = fVar6.high;
  }
LAB_00d94a63:
  a_local._8_8_ = fVar6.low;
  fVar7._10_6_ = fVar6._10_6_;
  fVar7.high = uVar4;
  fVar7.low = a_local._8_8_;
  return fVar7;
}

Assistant:

floatx80 floatx80_rem(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t q, term0, term1, alternateASig0, alternateASig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig0<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( (uint64_t) ( aSig0<<1 ) == 0 ) return a;
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        shift128Right( aSig0, 0, 1, &aSig0, &aSig1 );
        expDiff = 0;
    }
    q = ( bSig <= aSig0 );
    if ( q ) aSig0 -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        mul64To128( bSig, q, &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( aSig0, aSig1, 62, &aSig0, &aSig1 );
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        mul64To128( bSig, q<<( 64 - expDiff ), &term0, &term1 );
        sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        shortShift128Left( 0, bSig, 64 - expDiff, &term0, &term1 );
        while ( le128( term0, term1, aSig0, aSig1 ) ) {
            ++q;
            sub128( aSig0, aSig1, term0, term1, &aSig0, &aSig1 );
        }
    }
    else {
        term1 = 0;
        term0 = bSig;
    }
    sub128( term0, term1, aSig0, aSig1, &alternateASig0, &alternateASig1 );
    if (    lt128( alternateASig0, alternateASig1, aSig0, aSig1 )
         || (    eq128( alternateASig0, alternateASig1, aSig0, aSig1 )
              && ( q & 1 ) )
       ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
        zSign = ! zSign;
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);

}